

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_error.cpp
# Opt level: O3

unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_> __thiscall
pfederc::Parser::generateError
          (Parser *this,
          unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
          *syntaxError)

{
  Error<pfederc::SyntaxErrorCode> *pEVar1;
  Lexer *lexer;
  Lexer *this_00;
  unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
  *in_RDX;
  
  pEVar1 = (in_RDX->_M_t).
           super___uniq_ptr_impl<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_pfederc::Error<pfederc::SyntaxErrorCode>_*,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
           .super__Head_base<0UL,_pfederc::Error<pfederc::SyntaxErrorCode>_*,_false>._M_head_impl;
  std::
  vector<std::unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>>>,std::allocator<std::unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>>>>>
  ::
  emplace_back<std::unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>>>>
            ((vector<std::unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>>>,std::allocator<std::unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>>>>>
              *)(syntaxError + 1),in_RDX);
  lexer = (Lexer *)(syntaxError->_M_t).
                   super___uniq_ptr_impl<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_pfederc::Error<pfederc::SyntaxErrorCode>_*,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                   .super__Head_base<0UL,_pfederc::Error<pfederc::SyntaxErrorCode>_*,_false>.
                   _M_head_impl;
  this_00 = (Lexer *)operator_new(0x38);
  Expr::Expr((Expr *)this_00,lexer,EXPR_ERR,&pEVar1->pos);
  this_00->_vptr_Lexer = (_func_int **)&PTR__TokenExpr_00127ac0;
  this->lexer = this_00;
  return (__uniq_ptr_data<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>,_true,_true>)
         (__uniq_ptr_data<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>,_true,_true>)
         this;
}

Assistant:

std::unique_ptr<ErrorExpr> Parser::generateError(
    std::unique_ptr<SyntaxError> &&syntaxError) noexcept {
  
  const Position &pos = syntaxError->getPosition();
  errors.push_back(std::move(syntaxError));

  return std::make_unique<ErrorExpr>(lexer, pos);
}